

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O2

void HTS_Label_check_time(HTS_Label *label)

{
  double dVar1;
  HTS_LabelString *pHVar2;
  HTS_LabelString *pHVar3;
  double dVar4;
  
  pHVar2 = label->head;
  if (pHVar2 != (HTS_LabelString *)0x0) {
    pHVar2->start = 0.0;
  }
  while ((pHVar3 = pHVar2, pHVar3 != (HTS_LabelString *)0x0 &&
         (pHVar2 = pHVar3->next, pHVar2 != (_HTS_LabelString *)0x0))) {
    dVar4 = pHVar3->end;
    if ((0.0 <= dVar4) || (dVar1 = pHVar2->start, dVar1 < 0.0)) {
      if ((0.0 <= dVar4) && (pHVar2->start <= 0.0 && pHVar2->start != 0.0)) {
        pHVar2->start = dVar4;
      }
    }
    else {
      pHVar3->end = dVar1;
      dVar4 = dVar1;
    }
    if (pHVar3->start <= 0.0 && pHVar3->start != 0.0) {
      pHVar3->start = -1.0;
    }
    if (dVar4 < 0.0) {
      pHVar3->end = -1.0;
    }
  }
  return;
}

Assistant:

static void HTS_Label_check_time(HTS_Label * label)
{
   HTS_LabelString *lstring = label->head;
   HTS_LabelString *next = NULL;

   if (lstring)
      lstring->start = 0.0;
   while (lstring) {
      next = lstring->next;
      if (!next)
         break;
      if (lstring->end < 0.0 && next->start >= 0.0)
         lstring->end = next->start;
      else if (lstring->end >= 0.0 && next->start < 0.0)
         next->start = lstring->end;
      if (lstring->start < 0.0)
         lstring->start = -1.0;
      if (lstring->end < 0.0)
         lstring->end = -1.0;
      lstring = next;
   }
}